

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O3

void __thiscall tcmalloc::PageHeap::PageHeap(PageHeap *this)

{
  _Rb_tree_header *p_Var1;
  undefined8 *puVar2;
  long lVar3;
  Span *pSVar4;
  
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  lVar3 = 0x68;
  do {
    puVar2 = (undefined8 *)((long)this->small_normal_ + lVar3 + -0x38);
    *puVar2 = 0;
    puVar2[1] = 0;
    lVar3 = lVar3 + 0x48;
  } while (lVar3 != 0x2468);
  lVar3 = 0x2468;
  do {
    puVar2 = (undefined8 *)((long)this->small_normal_ + lVar3 + -0x38);
    *puVar2 = 0;
    puVar2[1] = 0;
    lVar3 = lVar3 + 0x48;
  } while (lVar3 != 0x4868);
  pSVar4 = this->small_returned_;
  p_Var1 = &(this->large_normal_)._M_t._M_impl.super__Rb_tree_header;
  (this->large_normal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->large_normal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->large_normal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->large_normal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->large_normal_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->large_returned_)._M_t._M_impl.super__Rb_tree_header;
  (this->large_returned_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->large_returned_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->large_returned_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->large_returned_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->large_returned_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->page_map_).internal_allocator.inited = false;
  (this->page_map_).internal_allocator.construct = true;
  (this->page_map_).leaf_allocator.inited = false;
  (this->page_map_).leaf_allocator.construct = true;
  this->release_index_ = 0;
  memset((this->page_map_).roots,0,0x2000020);
  (this->stat).large_normal_bytes = 0;
  (this->stat).large_returned_bytes = 0;
  this->release_rate_ = 100;
  lVar3 = 0x80;
  do {
    pSVar4[-0x80].prev = pSVar4 + -0x80;
    pSVar4[-0x80].next = pSVar4 + -0x80;
    pSVar4->prev = pSVar4;
    pSVar4->next = pSVar4;
    pSVar4 = pSVar4 + 1;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  return;
}

Assistant:

PageHeap() {
        stat.system_bytes = 0;
        stat.normal_bytes = 0;
        stat.returned_bytes = 0;
        stat.in_used_bytes = 0;

        stat.large_normal_bytes = 0;
        stat.large_returned_bytes = 0;

        release_index_ = 0;
        release_rate_ = 100;

        for (int i = 0; i <= spanSmallPages; ++i) {
            ListInit(&small_normal_[i]);
            ListInit(&small_returned_[i]);
        }
    }